

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandWriteScl(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *__filename;
  int iVar1;
  FILE *__stream;
  int c;
  char *pFileName;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (argc == globalUtilOptind + 1)) {
    if (pAbc->pLibScl == (void *)0x0) {
      fprintf((FILE *)pAbc->Err,"There is no Liberty library available.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      __filename = argv[globalUtilOptind];
      __stream = fopen(__filename,"wb");
      if (__stream == (FILE *)0x0) {
        fprintf((FILE *)pAbc->Err,"Cannot open output file \"%s\". \n",__filename);
        pAbc_local._4_4_ = 1;
      }
      else {
        fclose(__stream);
        Abc_SclWriteScl(__filename,(SC_Lib *)pAbc->pLibScl);
        pAbc_local._4_4_ = 0;
      }
    }
  }
  else {
    fprintf((FILE *)pAbc->Err,"usage: write_scl [-h] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         write extracted Liberty library into file\n");
    fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
    fprintf((FILE *)pAbc->Err,"\t<file> : the name of the file to write\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Scl_CommandWriteScl( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    char * pFileName;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    if ( pAbc->pLibScl == NULL )
    {
        fprintf( pAbc->Err, "There is no Liberty library available.\n" );
        return 1;
    }
    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "wb" )) == NULL )
    {
        fprintf( pAbc->Err, "Cannot open output file \"%s\". \n", pFileName );
        return 1;
    }
    fclose( pFile );

    // save current library
    Abc_SclWriteScl( pFileName, (SC_Lib *)pAbc->pLibScl );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_scl [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         write extracted Liberty library into file\n" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\t<file> : the name of the file to write\n" );
    return 1;
}